

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.hpp
# Opt level: O1

void diy::kdtree_sampling<Block,diy::Point<float,2u>>
               (Master *master,Assigner *assigner,int dim,ContinuousBounds *domain,
               offset_in_Block_to_vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>
               points,size_t samples,bool wrap)

{
  pointer *ppBVar1;
  Link *pLVar2;
  iterator iVar3;
  pointer pBVar4;
  bool bVar5;
  BlockID BVar6;
  BlockID BVar7;
  Assigner *assigner_00;
  size_t count;
  int iVar8;
  mapped_type *pmVar9;
  runtime_error *this;
  long lVar10;
  int iVar11;
  ulong uVar12;
  string_view format_str;
  format_args args;
  KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> kdtree_partition;
  KDTreePartners partners;
  allocator<int> local_451;
  BlockID local_450;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_448;
  Bounds *local_408;
  int local_400;
  undefined4 local_3fc;
  Assigner *local_3f8;
  long local_3f0;
  vector<diy::BlockID,std::allocator<diy::BlockID>> *local_3e8;
  Link *local_3e0;
  pointer *local_3d8;
  Neighbors *local_3d0;
  Neighbors *local_3c8;
  pointer local_3c0;
  pointer local_3b8;
  Master *local_3b0;
  ulong local_3a8;
  size_t local_3a0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_398;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_358;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_318;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_2d8;
  undefined1 local_298 [8];
  pointer local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  type local_278;
  type local_268;
  type tStack_264;
  _Base_ptr local_260;
  Factory<diy::Link> local_258;
  type *ptStack_250;
  pointer local_248;
  pointer local_240;
  Factory<diy::Link> FStack_238;
  pointer local_230;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> local_228;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> local_1e8;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> local_1a8;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> local_168;
  pointer local_128;
  pointer pBStack_120;
  Factory<diy::Link> local_118;
  pointer local_110;
  pointer pBStack_108;
  pointer local_100;
  Factory<diy::Link> local_f8;
  pointer pDStack_f0;
  pointer local_e8;
  
  local_408 = domain;
  local_3f8 = assigner;
  local_3c0 = (pointer)points;
  local_3b8 = (pointer)samples;
  if ((assigner->nblocks_ & assigner->nblocks_ - 1U) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_448._0_8_ = ZEXT48((uint)local_3f8->nblocks_);
    format_str.size_ = 1;
    format_str.data_ = (char *)0x3f;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                  )samples;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_448;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_298,
               (detail *)"KD-tree requires a number of blocks that\'s a power of 2, got {}",
               format_str,args);
    std::runtime_error::runtime_error(this,(string *)local_298);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0 < (int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
    local_3a0 = (size_t)dim;
    local_3a8 = (ulong)(uint)dim;
    lVar10 = 0;
    local_400 = dim;
    local_3b0 = master;
    do {
      pLVar2 = (master->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10];
      local_3f0 = lVar10;
      RegularLink<diy::Bounds<float>_>::RegularLink
                ((RegularLink<diy::Bounds<float>_> *)local_298,dim,local_408,local_408);
      local_3e8 = (vector<diy::BlockID,std::allocator<diy::BlockID>> *)&pLVar2->neighbors_;
      Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::_M_move_assign
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)local_3e8,&local_290);
      *(type *)(pLVar2 + 1) = local_278;
      local_3c8 = &pLVar2[1].neighbors_;
      Catch::clara::std::
      _Rb_tree<diy::Direction,_std::pair<const_diy::Direction,_int>,_std::_Select1st<std::pair<const_diy::Direction,_int>_>,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
      ::clear((_Rb_tree<diy::Direction,_std::pair<const_diy::Direction,_int>,_std::_Select1st<std::pair<const_diy::Direction,_int>_>,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
               *)local_3c8);
      if (local_260 != (_Base_ptr)0x0) {
        *(type *)((long)&pLVar2[1].neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8) =
             local_268;
        *(_Base_ptr *)
         ((long)&pLVar2[1].neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10) = local_260
        ;
        pLVar2[2].super_Factory<diy::Link>._vptr_Factory = local_258._vptr_Factory;
        *(type **)&pLVar2[2].neighbors_.
                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl =
             ptStack_250;
        local_260->_M_parent =
             (_Base_ptr)
             ((long)&pLVar2[1].neighbors_.
                     super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
        *(pointer *)
         ((long)&pLVar2[2].neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8) = local_248;
        local_260 = (_Base_ptr)0x0;
        local_258._vptr_Factory = (_func_int **)&local_268;
        local_248 = (pointer)0x0;
        ptStack_250 = (type *)local_258._vptr_Factory;
      }
      local_448._0_8_ =
           *(pointer *)
            ((long)&pLVar2[2].neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10);
      local_448.m_begin = (pointer)pLVar2[3].super_Factory<diy::Link>._vptr_Factory;
      local_448.m_end =
           *(pointer *)
            &pLVar2[3].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
             _M_impl;
      *(pointer *)
       ((long)&pLVar2[2].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
       + 0x10) = local_240;
      pLVar2[3].super_Factory<diy::Link>._vptr_Factory = FStack_238._vptr_Factory;
      *(pointer *)
       &pLVar2[3].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
           = local_230;
      local_240 = (pointer)0x0;
      FStack_238._vptr_Factory = (_func_int **)0x0;
      local_230 = (pointer)0x0;
      Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::~vector
                ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)&local_448);
      itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
                ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                 ((long)&pLVar2[3].neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8),
                 &local_228);
      itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
                ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                 ((long)&pLVar2[5].neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8),
                 &local_1e8);
      itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
                ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                 ((long)&pLVar2[7].neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8),
                 &local_1a8);
      itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
                ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                 ((long)&pLVar2[9].neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8),
                 &local_168);
      local_448._0_8_ =
           *(pointer *)
            ((long)&pLVar2[0xb].neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
      local_448.m_begin =
           *(pointer *)
            ((long)&pLVar2[0xb].neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10);
      local_448.m_end = (pointer)pLVar2[0xc].super_Factory<diy::Link>._vptr_Factory;
      *(pointer *)
       ((long)&pLVar2[0xb].neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8) = local_128;
      *(pointer *)
       ((long)&pLVar2[0xb].neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10) = pBStack_120
      ;
      pLVar2[0xc].super_Factory<diy::Link>._vptr_Factory = local_118._vptr_Factory;
      local_128 = (pointer)0x0;
      pBStack_120 = (pointer)0x0;
      local_118._vptr_Factory = (_func_int **)0x0;
      Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::~vector
                ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)&local_448);
      local_448._0_8_ =
           *(undefined8 *)
            &pLVar2[0xc].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
             _M_impl;
      local_448.m_begin =
           *(pointer *)
            ((long)&pLVar2[0xc].neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
      local_448.m_end =
           *(pointer *)
            ((long)&pLVar2[0xc].neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10);
      *(pointer *)
       &pLVar2[0xc].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
        _M_impl = local_110;
      *(pointer *)
       ((long)&pLVar2[0xc].neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8) = pBStack_108;
      *(pointer *)
       ((long)&pLVar2[0xc].neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10) = local_100;
      local_110 = (pointer)0x0;
      pBStack_108 = (pointer)0x0;
      local_100 = (pointer)0x0;
      Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::~vector
                ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)&local_448);
      local_448._0_8_ = pLVar2[0xd].super_Factory<diy::Link>._vptr_Factory;
      local_448.m_begin =
           *(pointer *)
            &pLVar2[0xd].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
             _M_impl;
      local_448.m_end =
           *(pointer *)
            ((long)&pLVar2[0xd].neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
      pLVar2[0xd].super_Factory<diy::Link>._vptr_Factory = local_f8._vptr_Factory;
      *(pointer *)
       &pLVar2[0xd].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
        _M_impl = pDStack_f0;
      *(pointer *)
       ((long)&pLVar2[0xd].neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8) = local_e8;
      local_f8._vptr_Factory = (_func_int **)0x0;
      pDStack_f0 = (pointer)0x0;
      local_e8 = (pointer)0x0;
      Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::~vector
                ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)&local_448);
      RegularLink<diy::Bounds<float>_>::~RegularLink((RegularLink<diy::Bounds<float>_> *)local_298);
      if (wrap) {
        local_450.gid =
             (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[local_3f0];
        local_450.proc = (master->comm_).rank_;
        bVar5 = 0 < dim;
        master = local_3b0;
        dim = local_400;
        if (bVar5) {
          local_3d8 = (pointer *)
                      ((long)&pLVar2[2].neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10
                      );
          local_3d0 = &pLVar2[0xc].neighbors_;
          local_3e0 = pLVar2 + 0xd;
          uVar12 = 0;
          do {
            count = local_3a0;
            local_448._0_8_ = local_448._0_8_ & 0xffffffff00000000;
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)local_298,local_3a0,
                       (int *)&local_448,(allocator<int> *)&local_3fc);
            local_3fc = 0;
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_448,count,(int *)&local_3fc,&local_451);
            (&local_290->gid)[uVar12] = -1;
            *(int *)((long)&((Point *)local_448.m_begin)->
                            super_small_vector<float,_4UL,_0UL,_std::allocator<float>_> + uVar12 * 4
                    ) = -1;
            iVar3._M_current =
                 *(pointer *)
                  ((long)&(pLVar2->neighbors_).
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
            if (iVar3._M_current ==
                *(pointer *)
                 ((long)&(pLVar2->neighbors_).
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10)) {
              std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
              _M_realloc_insert<diy::BlockID_const&>(local_3e8,iVar3,&local_450);
            }
            else {
              BVar6.proc = local_450.proc;
              BVar6.gid = local_450.gid;
              *iVar3._M_current = BVar6;
              ppBVar1 = (pointer *)
                        ((long)&(pLVar2->neighbors_).
                                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8)
              ;
              *ppBVar1 = *ppBVar1 + 1;
            }
            Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::
            push_back((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)local_3d0,
                      local_408);
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_2d8,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)local_298,
                       (allocator<int> *)&local_3fc);
            pBVar4 = *(pointer *)
                      ((long)&pLVar2[2].neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
            pmVar9 = Catch::clara::std::
                     map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                     ::operator[]((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                                   *)local_3c8,(key_type *)&local_2d8);
            *pmVar9 = (mapped_type)pBVar4;
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)local_3d8,
                       (value_type *)&local_2d8);
            local_2d8.m_end = local_2d8.m_begin;
            if (local_2d8.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_2d8.m_dynamic_data,local_2d8.m_dynamic_capacity << 2);
            }
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_318,&local_448,(allocator<int> *)&local_3fc);
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)local_3e0,
                       (value_type *)&local_318);
            local_318.m_end = local_318.m_begin;
            if (local_318.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_318.m_dynamic_data,local_318.m_dynamic_capacity << 2);
            }
            (&local_290->gid)[uVar12] = 1;
            *(int *)((long)&((Point *)local_448.m_begin)->
                            super_small_vector<float,_4UL,_0UL,_std::allocator<float>_> + uVar12 * 4
                    ) = 1;
            iVar3._M_current =
                 *(pointer *)
                  ((long)&(pLVar2->neighbors_).
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
            if (iVar3._M_current ==
                *(pointer *)
                 ((long)&(pLVar2->neighbors_).
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 0x10)) {
              std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
              _M_realloc_insert<diy::BlockID_const&>(local_3e8,iVar3,&local_450);
            }
            else {
              BVar7.proc = local_450.proc;
              BVar7.gid = local_450.gid;
              *iVar3._M_current = BVar7;
              ppBVar1 = (pointer *)
                        ((long)&(pLVar2->neighbors_).
                                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8)
              ;
              *ppBVar1 = *ppBVar1 + 1;
            }
            Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::
            push_back((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)local_3d0,
                      local_408);
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_358,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)local_298,
                       (allocator<int> *)&local_3fc);
            pBVar4 = *(pointer *)
                      ((long)&pLVar2[2].neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8);
            pmVar9 = Catch::clara::std::
                     map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                     ::operator[]((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                                   *)local_3c8,(key_type *)&local_358);
            *pmVar9 = (mapped_type)pBVar4;
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)local_3d8,
                       (value_type *)&local_358);
            local_358.m_end = local_358.m_begin;
            if (local_358.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_358.m_dynamic_data,local_358.m_dynamic_capacity << 2);
            }
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_398,&local_448,(allocator<int> *)&local_3fc);
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)local_3e0,
                       (value_type *)&local_398);
            local_398.m_end = local_398.m_begin;
            if (local_398.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_398.m_dynamic_data,local_398.m_dynamic_capacity << 2);
            }
            local_448.m_end = local_448.m_begin;
            if (local_448.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_448.m_dynamic_data,local_448.m_dynamic_capacity << 2);
            }
            local_288._M_allocated_capacity = (size_type)local_290;
            if (local_260 != (_Base_ptr)0x0) {
              operator_delete(local_260,CONCAT44(tStack_264,local_268) << 2);
            }
            uVar12 = uVar12 + 1;
            master = local_3b0;
            dim = local_400;
          } while (local_3a8 != uVar12);
        }
      }
      lVar10 = local_3f0 + 1;
    } while (lVar10 < (int)((ulong)((long)(master->blocks_).elements_.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(master->blocks_).elements_.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_start) >> 3));
  }
  assigner_00 = local_3f8;
  local_448._0_4_ = dim;
  local_448.m_begin = (pointer)local_3c0;
  local_448.m_end = (pointer)local_3b8;
  detail::KDTreePartners::KDTreePartners
            ((KDTreePartners *)local_298,dim,local_3f8->nblocks_,wrap,local_408);
  reduce<diy::detail::KDTreeSamplingPartition<Block,diy::Point<float,2u>>,diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>
            (master,assigner_00,(KDTreePartners *)local_298,
             (KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> *)&local_448,
             (ReduceNeverSkip *)&local_450);
  if ((int)((ulong)((long)(master->blocks_).elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(master->blocks_).elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < 1) {
    iVar11 = 0;
  }
  else {
    lVar10 = 0;
    iVar11 = 0;
    do {
      iVar8 = Link::size_unique((master->links_).
                                super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar10]);
      iVar11 = iVar11 + iVar8;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)(master->blocks_).elements_.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(master->blocks_).elements_.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_start) >> 3));
  }
  master->expected_ = iVar11;
  detail::KDTreePartners::~KDTreePartners((KDTreePartners *)local_298);
  return;
}

Assistant:

void kdtree_sampling
               (Master&                         master,      //!< master object
                const Assigner&                 assigner,    //!< assigner object
                int                             dim,         //!< dimensionality
                const ContinuousBounds&         domain,      //!< global data extents
                std::vector<Point>  Block::*    points,      //!< input points to sort into kd-tree
                size_t                          samples,     //!< number of samples to take in each block
                bool                            wrap = false)//!< periodic boundaries in all dimensions
    {
        if (assigner.nblocks() & (assigner.nblocks() - 1))
            throw std::runtime_error(fmt::format("KD-tree requires a number of blocks that's a power of 2, got {}", assigner.nblocks()));

        typedef     diy::RegularContinuousLink      RCLink;

        for (int i = 0; i < static_cast<int>(master.size()); ++i)
        {
            RCLink* link   = static_cast<RCLink*>(master.link(i));
            *link = RCLink(dim, domain, domain);

            if (wrap)       // set up the links to self
            {
                diy::BlockID self = { master.gid(i), master.communicator().rank() };
                for (int j = 0; j < dim; ++j)
                {
                    diy::Direction dir(dim,0), wrap_dir(dim,0);

                    // left
                    dir[j] = -1; wrap_dir[j] = -1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);

                    // right
                    dir[j] = 1; wrap_dir[j] = 1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);
                }
            }
        }

        detail::KDTreeSamplingPartition<Block,Point>    kdtree_partition(dim, points, samples);

        detail::KDTreePartners                          partners(dim, assigner.nblocks(), wrap, domain);
        reduce(master, assigner, partners, kdtree_partition);

        // update master.expected to match the links
        int expected = 0;
        for (int i = 0; i < static_cast<int>(master.size()); ++i)
            expected += master.link(i)->size_unique();
        master.set_expected(expected);
    }